

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void divide_subset_split(size_t *ix_arr,int *x,size_t st,size_t end,MissingAction missing_action,
                        NewCategAction new_cat_action,bool move_new_to_left,size_t *st_NA,
                        size_t *end_NA,size_t *split_ix)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (missing_action == Fail) {
    sVar2 = st;
    end_NA = split_ix;
    if (new_cat_action != Smallest || !move_new_to_left) {
      for (; sVar2 <= end; sVar2 = sVar2 + 1) {
        if (x[ix_arr[sVar2]] == 0) {
          sVar1 = ix_arr[st];
          ix_arr[st] = ix_arr[sVar2];
          ix_arr[sVar2] = sVar1;
          st = st + 1;
        }
      }
    }
    else {
      for (; sVar2 <= end; sVar2 = sVar2 + 1) {
        if (x[ix_arr[sVar2]] == 0 || 1 < x[ix_arr[sVar2]]) {
          sVar1 = ix_arr[st];
          ix_arr[st] = ix_arr[sVar2];
          ix_arr[sVar2] = sVar1;
          st = st + 1;
        }
      }
    }
  }
  else {
    uVar3 = st;
    if (new_cat_action != Smallest || !move_new_to_left) {
      for (; uVar3 <= end; uVar3 = uVar3 + 1) {
        if (x[ix_arr[uVar3]] == 0) {
          sVar2 = ix_arr[st];
          ix_arr[st] = ix_arr[uVar3];
          ix_arr[uVar3] = sVar2;
          st = st + 1;
        }
      }
      *st_NA = st;
      for (sVar2 = st; sVar2 <= end; sVar2 = sVar2 + 1) {
        if (x[ix_arr[sVar2]] < 0) {
          sVar1 = ix_arr[st];
          ix_arr[st] = ix_arr[sVar2];
          ix_arr[sVar2] = sVar1;
          st = st + 1;
        }
      }
    }
    else {
      for (; uVar3 <= end; uVar3 = uVar3 + 1) {
        if (x[ix_arr[uVar3]] == 0 || 1 < x[ix_arr[uVar3]]) {
          sVar2 = ix_arr[st];
          ix_arr[st] = ix_arr[uVar3];
          ix_arr[uVar3] = sVar2;
          st = st + 1;
        }
      }
      *st_NA = st;
      for (sVar2 = st; sVar2 <= end; sVar2 = sVar2 + 1) {
        if (x[ix_arr[sVar2]] < 0) {
          sVar1 = ix_arr[st];
          ix_arr[st] = ix_arr[sVar2];
          ix_arr[sVar2] = sVar1;
          st = st + 1;
        }
      }
    }
  }
  *end_NA = st;
  return;
}

Assistant:

void divide_subset_split(size_t *restrict ix_arr, int x[], size_t st, size_t end,
                         MissingAction missing_action, NewCategAction new_cat_action,
                         bool move_new_to_left, size_t &restrict st_NA, size_t &restrict end_NA, size_t &restrict split_ix) noexcept
{
    size_t temp;

    /* if NAs are not to be bothered with, just need to do a single pass */
    if (missing_action == Fail)
    {
        /* move to the left if it's l.e. than the split point */
        if (new_cat_action == Smallest && move_new_to_left)
        {
            for (size_t row = st; row <= end; row++)
            {
                if (x[ix_arr[row]] == 0 || x[ix_arr[row]] > 1)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else
        {
            for (size_t row = st; row <= end; row++)
            {
                if (x[ix_arr[row]] == 0)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }
        split_ix = st;
    }

    /* otherwise, first put to the left all l.e. and not NA, then all NAs to the end of the left */
    else
    {
        if (new_cat_action == Smallest && move_new_to_left)
        {
            for (size_t row = st; row <= end; row++)
            {
                if (x[ix_arr[row]] == 0 || x[ix_arr[row]] > 1)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
            st_NA = st;

            for (size_t row = st; row <= end; row++)
            {
                if (unlikely(x[ix_arr[row]] < 0))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
            end_NA = st;
        }

        else
        {
            for (size_t row = st; row <= end; row++)
            {
                if (x[ix_arr[row]] == 0)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
            st_NA = st;

            for (size_t row = st; row <= end; row++)
            {
                if (unlikely(x[ix_arr[row]] < 0))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
            end_NA = st;
        }
    }
}